

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intra_pred_avx2.c
# Opt level: O3

void uavs3d_ipred_ang_x_6_avx2(pel *src,pel *dst,int i_dst,int mode,int width,int height)

{
  undefined1 uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  int iVar6;
  int iVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  int iVar15;
  long lVar16;
  ulong *puVar17;
  ulong uVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [32];
  undefined1 auVar21 [16];
  undefined1 auVar22 [32];
  undefined1 uStack_99;
  undefined8 uStack_98;
  undefined8 uStack_90;
  pel apStack_88 [8];
  pel first_line [128];
  
  iVar15 = width + height + -1;
  iVar7 = width * 2;
  iVar6 = iVar7;
  if (iVar15 < iVar7) {
    iVar6 = iVar15;
  }
  puVar17 = (ulong *)(src + 2);
  uVar18 = 0;
  if (8 < iVar6) {
    uVar18 = 0;
    auVar20._8_2_ = 2;
    auVar20._0_8_ = 0x2000200020002;
    auVar20._10_2_ = 2;
    auVar20._12_2_ = 2;
    auVar20._14_2_ = 2;
    auVar20._16_2_ = 2;
    auVar20._18_2_ = 2;
    auVar20._20_2_ = 2;
    auVar20._22_2_ = 2;
    auVar20._24_2_ = 2;
    auVar20._26_2_ = 2;
    auVar20._28_2_ = 2;
    auVar20._30_2_ = 2;
    do {
      auVar22 = vpmovzxbw_avx2(*(undefined1 (*) [16])(src + uVar18 + 1));
      auVar4 = vpmovzxbw_avx2(*(undefined1 (*) [16])(src + uVar18 + 2));
      auVar5 = vpmovzxbw_avx2(*(undefined1 (*) [16])(src + uVar18 + 3));
      auVar22 = vpaddw_avx2(auVar22,auVar5);
      auVar4 = vpaddw_avx2(auVar4,auVar4);
      auVar22 = vpaddw_avx2(auVar22,auVar4);
      auVar22 = vpaddw_avx2(auVar22,auVar20);
      auVar22 = vpsrlw_avx2(auVar22,2);
      auVar19 = vpackuswb_avx(auVar22._0_16_,auVar22._16_16_);
      *(undefined1 (*) [16])((long)&uStack_98 + uVar18) = auVar19;
      uVar18 = uVar18 + 0x10;
    } while (uVar18 < iVar6 - 8);
    puVar17 = (ulong *)((long)puVar17 + uVar18);
  }
  if ((int)uVar18 < iVar6) {
    auVar19._8_8_ = 0;
    auVar19._0_8_ = *(ulong *)((long)puVar17 + -1);
    auVar19 = vpmovzxbw_avx(auVar19);
    auVar2._8_8_ = 0;
    auVar2._0_8_ = *puVar17;
    auVar2 = vpmovzxbw_avx(auVar2);
    auVar3._8_8_ = 0;
    auVar3._0_8_ = *(ulong *)((long)puVar17 + 1);
    auVar3 = vpmovzxbw_avx(auVar3);
    auVar19 = vpaddw_avx(auVar19,auVar3);
    auVar2 = vpaddw_avx(auVar2,auVar2);
    auVar19 = vpaddw_avx(auVar19,auVar2);
    auVar21._8_2_ = 2;
    auVar21._0_8_ = 0x2000200020002;
    auVar21._10_2_ = 2;
    auVar21._12_2_ = 2;
    auVar21._14_2_ = 2;
    auVar19 = vpaddw_avx(auVar19,auVar21);
    auVar19 = vpsrlw_avx(auVar19,2);
    auVar19 = vpackuswb_avx(auVar19,auVar19);
    *(long *)((long)&uStack_98 + (uVar18 & 0xffffffff)) = auVar19._0_8_;
  }
  if (iVar7 < iVar15) {
    lVar16 = (long)iVar7;
    do {
      uVar1 = (&uStack_99)[iVar6];
      *(undefined1 *)((long)&uStack_98 + lVar16) = uVar1;
      *(undefined1 *)((long)&uStack_98 + lVar16 + 1) = uVar1;
      *(undefined1 *)((long)&uStack_98 + lVar16 + 2) = uVar1;
      *(undefined1 *)((long)&uStack_98 + lVar16 + 3) = uVar1;
      *(undefined1 *)((long)&uStack_98 + lVar16 + 4) = uVar1;
      *(undefined1 *)((long)&uStack_98 + lVar16 + 5) = uVar1;
      *(undefined1 *)((long)&uStack_98 + lVar16 + 6) = uVar1;
      *(undefined1 *)((long)&uStack_98 + lVar16 + 7) = uVar1;
      *(undefined1 *)((long)&uStack_90 + lVar16) = uVar1;
      *(undefined1 *)((long)&uStack_90 + lVar16 + 1) = uVar1;
      *(undefined1 *)((long)&uStack_90 + lVar16 + 2) = uVar1;
      *(undefined1 *)((long)&uStack_90 + lVar16 + 3) = uVar1;
      *(undefined1 *)((long)&uStack_90 + lVar16 + 4) = uVar1;
      *(undefined1 *)((long)&uStack_90 + lVar16 + 5) = uVar1;
      *(undefined1 *)((long)&uStack_90 + lVar16 + 6) = uVar1;
      *(undefined1 *)((long)&uStack_90 + lVar16 + 7) = uVar1;
      lVar16 = lVar16 + 0x10;
    } while (lVar16 < iVar15);
  }
  if (width < 0x10) {
    if (width == 4) {
      if (0 < height) {
        uVar18 = 0;
        do {
          *(undefined4 *)dst = *(undefined4 *)((long)&uStack_98 + uVar18);
          dst = dst + i_dst;
          uVar18 = uVar18 + 1;
        } while ((uint)height != uVar18);
      }
    }
    else if ((width == 8) && (0 < height)) {
      uVar18 = 0;
      do {
        *(undefined8 *)dst = *(undefined8 *)((long)&uStack_98 + uVar18);
        dst = dst + i_dst;
        uVar18 = uVar18 + 1;
      } while ((uint)height != uVar18);
    }
  }
  else if (width == 0x10) {
    if (0 < height) {
      uVar18 = 0;
      do {
        uVar8 = *(undefined8 *)((long)&uStack_90 + uVar18);
        *(undefined8 *)dst = *(undefined8 *)((long)&uStack_98 + uVar18);
        *(undefined8 *)(dst + 8) = uVar8;
        dst = dst + i_dst;
        uVar18 = uVar18 + 1;
      } while ((uint)height != uVar18);
    }
  }
  else if (width == 0x20) {
    if (0 < height) {
      uVar18 = 0;
      do {
        uVar8 = *(undefined8 *)((long)&uStack_90 + uVar18);
        uVar9 = *(undefined8 *)(first_line + (uVar18 - 8));
        uVar10 = *(undefined8 *)(first_line + uVar18);
        *(undefined8 *)dst = *(undefined8 *)((long)&uStack_98 + uVar18);
        *(undefined8 *)(dst + 8) = uVar8;
        *(undefined8 *)(dst + 0x10) = uVar9;
        *(undefined8 *)(dst + 0x18) = uVar10;
        dst = dst + i_dst;
        uVar18 = uVar18 + 1;
      } while ((uint)height != uVar18);
    }
  }
  else if ((width == 0x40) && (0 < height)) {
    uVar18 = 0;
    do {
      uVar8 = *(undefined8 *)((long)&uStack_98 + uVar18);
      uVar9 = *(undefined8 *)((long)&uStack_90 + uVar18);
      uVar10 = *(undefined8 *)(first_line + (uVar18 - 8));
      uVar11 = *(undefined8 *)(first_line + uVar18);
      uVar12 = *(undefined8 *)(first_line + uVar18 + 0x10);
      uVar13 = *(undefined8 *)(first_line + uVar18 + 0x18);
      uVar14 = *(undefined8 *)(first_line + uVar18 + 0x20);
      *(undefined8 *)(dst + 0x20) = *(undefined8 *)(first_line + uVar18 + 8);
      *(undefined8 *)(dst + 0x28) = uVar12;
      *(undefined8 *)(dst + 0x30) = uVar13;
      *(undefined8 *)(dst + 0x38) = uVar14;
      *(undefined8 *)dst = uVar8;
      *(undefined8 *)(dst + 8) = uVar9;
      *(undefined8 *)(dst + 0x10) = uVar10;
      *(undefined8 *)(dst + 0x18) = uVar11;
      dst = dst + i_dst;
      uVar18 = uVar18 + 1;
    } while ((uint)height != uVar18);
  }
  return;
}

Assistant:

void uavs3d_ipred_ang_x_6_avx2(pel *src, pel *dst, int i_dst, int mode, int width, int height)
{
    ALIGNED_16(pel first_line[64 + 64]);
    int line_size = width + height - 1;
    int real_size = COM_MIN(line_size, width * 2);
    int i;
    __m256i zero = _mm256_setzero_si256();
    __m256i offset = _mm256_set1_epi16(2);
    src += 2;

    for (i = 0; i < real_size - 8; i += 16, src += 16) {
        __m256i S0 = _mm256_set_epi64x(0, *(s64 *)(src + 7), 0, *(s64 *)(src - 1));
        __m256i S1 = _mm256_set_epi64x(0, *(s64 *)(src + 8), 0, *(s64 *)(src));
        __m256i S2 = _mm256_set_epi64x(0, *(s64 *)(src + 9), 0, *(s64 *)(src + 1));

        __m256i L0 = _mm256_unpacklo_epi8(S0, zero);
        __m256i L1 = _mm256_unpacklo_epi8(S1, zero);
        __m256i L2 = _mm256_unpacklo_epi8(S2, zero);

        __m256i sum1 = _mm256_add_epi16(L0, L1);
        __m256i sum2 = _mm256_add_epi16(L1, L2);
        __m128i d0;

        sum1 = _mm256_add_epi16(sum1, sum2);

        sum1 = _mm256_add_epi16(sum1, offset);

        sum1 = _mm256_srli_epi16(sum1, 2);

        d0 = _mm_packus_epi16(_mm256_castsi256_si128(sum1), _mm256_extracti128_si256(sum1, 1));

        _mm_store_si128((__m128i *)&first_line[i], d0);
    }

    if (i < real_size) {
        __m128i zero = _mm_setzero_si128();
        __m128i offset = _mm_set1_epi16(2);
        __m128i S0 = _mm_loadu_si128((__m128i *)(src - 1));
        __m128i S2 = _mm_loadu_si128((__m128i *)(src + 1));
        __m128i S1 = _mm_loadu_si128((__m128i *)(src));

        __m128i L0 = _mm_unpacklo_epi8(S0, zero);
        __m128i L1 = _mm_unpacklo_epi8(S1, zero);
        __m128i L2 = _mm_unpacklo_epi8(S2, zero);

        __m128i sum1 = _mm_add_epi16(L0, L1);
        __m128i sum2 = _mm_add_epi16(L1, L2);

        sum1 = _mm_add_epi16(sum1, sum2);
        sum1 = _mm_add_epi16(sum1, offset);
        sum1 = _mm_srli_epi16(sum1, 2);

        sum1 = _mm_packus_epi16(sum1, sum1);
        _mm_storel_epi64((__m128i *)&first_line[i], sum1);
    }

    // padding
    for (i = real_size; i < line_size; i += 16) {
        __m128i pad = _mm_set1_epi8((char)first_line[real_size - 1]);
        _mm_storeu_si128((__m128i *)&first_line[i], pad);
    }

#define COPY_X6(w) { \
    for (i = 0; i < height; i++) { \
        memcpy(dst, first_line + i, w * sizeof(pel)); \
        dst += i_dst;\
    } \
}
    switch (width) {
    case 4:
        COPY_X6(4)
            break;
    case 8:
        COPY_X6(8)
            break;
    case 16:
        COPY_X6(16)
            break;
    case 32:
        COPY_X6(32)
            break;
    case 64:
        COPY_X6(64)
            break;
    }
}